

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_acos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  unary_op_acos *this;
  long *in_RDI;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_acos op;
  Mat *m;
  float *in_stack_fffffffffffffd00;
  unary_op_acos *in_stack_fffffffffffffd08;
  unary_op_acos *in_stack_fffffffffffffd10;
  __m256 *in_stack_fffffffffffffd20;
  __m512 *in_stack_fffffffffffffd60;
  unary_op_acos *in_stack_fffffffffffffd68;
  int local_23c;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined4 local_220;
  long local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined8 local_1f8;
  unary_op_acos *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  long *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_190;
  unary_op_acos *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  unary_op_acos *local_130;
  unary_op_acos *local_128;
  __m512 *local_120;
  unary_op_acos *puStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  unary_op_acos *local_f0;
  unary_op_acos *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  unary_op_acos *local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  unary_op_acos *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined8 *local_78;
  
  local_1d0 = *(int *)((long)in_RDI + 0x2c);
  local_1d4 = (int)in_RDI[6];
  local_1d8 = *(int *)((long)in_RDI + 0x34);
  local_1dc = (int)in_RDI[7];
  local_1e0 = (int)in_RDI[3];
  local_1e4 = local_1d0 * local_1d4 * local_1d8 * local_1e0;
  local_1c0 = in_RDI;
  for (local_1e8 = 0; local_1e8 < local_1dc; local_1e8 = local_1e8 + 1) {
    local_1a8 = &local_238;
    local_9c = *(int *)((long)local_1c0 + 0x2c);
    local_a0 = (int)local_1c0[6];
    local_a4 = *(undefined4 *)((long)local_1c0 + 0x34);
    this = (unary_op_acos *)(*local_1c0 + local_1c0[8] * (long)local_1e8 * local_1c0[2]);
    local_b8 = local_1c0[2];
    local_bc = (undefined4)local_1c0[3];
    local_c8 = local_1c0[4];
    local_98 = &local_238;
    local_88 = (long)local_9c * (long)local_a0 * local_b8;
    local_1a0 = &local_238;
    local_190 = &local_238;
    local_8c = 0x10;
    local_1b4 = local_1e8;
    local_1b5 = 1;
    local_238 = 0;
    local_228 = 0;
    local_220 = 0;
    local_210 = 0;
    local_20c = 0;
    local_208 = 0;
    local_204 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_230 = 0;
    local_1f0 = this;
    local_b0 = this;
    local_78 = local_190;
    local_218 = local_c8;
    for (local_23c = 0; local_23c + 0xf < local_1e4; local_23c = local_23c + 0x10) {
      local_188 = local_1f0;
      uVar5 = *(undefined8 *)local_1f0;
      uVar8 = *(undefined8 *)(local_1f0 + 8);
      uVar6 = *(undefined8 *)(local_1f0 + 0x10);
      uVar7 = *(undefined8 *)(local_1f0 + 0x18);
      uVar9 = *(undefined8 *)(local_1f0 + 0x20);
      uVar10 = *(undefined8 *)(local_1f0 + 0x28);
      uVar11 = *(undefined8 *)(local_1f0 + 0x30);
      uVar12 = *(undefined8 *)(local_1f0 + 0x38);
      UnaryOp_x86_avx512_functor::unary_op_acos::func_pack16
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      local_130 = local_1f0;
      auVar1._8_8_ = uVar8;
      auVar1._0_8_ = uVar5;
      auVar1._16_8_ = uVar6;
      auVar1._24_8_ = uVar7;
      auVar1._32_8_ = uVar9;
      auVar1._40_8_ = uVar10;
      auVar1._48_8_ = uVar11;
      auVar1._56_8_ = uVar12;
      *(undefined1 (*) [64])local_1f0 = auVar1;
      local_1f0 = local_1f0 + 0x40;
      local_180 = uVar5;
      uStack_178 = uVar8;
      uStack_170 = uVar6;
      uStack_168 = uVar7;
      uStack_160 = uVar9;
      uStack_158 = uVar10;
      uStack_150 = uVar11;
      uStack_148 = uVar12;
    }
    for (; local_23c + 7 < local_1e4; local_23c = local_23c + 8) {
      local_128 = local_1f0;
      in_stack_fffffffffffffd60 = *(__m512 **)local_1f0;
      in_stack_fffffffffffffd68 = *(unary_op_acos **)(local_1f0 + 8);
      uVar5 = *(undefined8 *)(local_1f0 + 0x10);
      uVar8 = *(undefined8 *)(local_1f0 + 0x18);
      UnaryOp_x86_avx512_functor::unary_op_acos::func_pack8(this,in_stack_fffffffffffffd20);
      local_f0 = local_1f0;
      auVar2._8_8_ = in_stack_fffffffffffffd68;
      auVar2._0_8_ = in_stack_fffffffffffffd60;
      auVar2._16_8_ = uVar5;
      auVar2._24_8_ = uVar8;
      *(undefined1 (*) [32])local_1f0 = auVar2;
      local_1f0 = local_1f0 + 0x20;
      local_120 = in_stack_fffffffffffffd60;
      puStack_118 = in_stack_fffffffffffffd68;
      uStack_110 = uVar5;
      uStack_108 = uVar8;
    }
    for (; local_23c + 3 < local_1e4; local_23c = local_23c + 4) {
      local_e8 = local_1f0;
      uVar5 = *(undefined8 *)(local_1f0 + 8);
      afVar13 = UnaryOp_x86_avx512_functor::unary_op_acos::func_pack4
                          (in_stack_fffffffffffffd10,(__m128 *)in_stack_fffffffffffffd08);
      local_e0 = afVar13._0_8_;
      local_d0 = local_1f0;
      auVar3._8_8_ = uVar5;
      auVar3._0_8_ = local_e0;
      *(undefined1 (*) [16])local_1f0 = auVar3;
      local_1f0 = local_1f0 + 0x10;
      uStack_d8 = uVar5;
    }
    for (; local_23c < local_1e4; local_23c = local_23c + 1) {
      fVar4 = UnaryOp_x86_avx512_functor::unary_op_acos::func
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      *(float *)local_1f0 = fVar4;
      local_1f0 = local_1f0 + 4;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}